

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

PrintStatus __thiscall
choc::html::HTMLElement::print<std::__cxx11::ostringstream>
          (HTMLElement *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
          size_t indent,PrintStatus status)

{
  size_type sVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  reference pbVar5;
  byte local_e1;
  allocator<char> local_d1;
  string local_d0 [36];
  PrintStatus local_ac;
  PrintStatus local_aa;
  reference local_a8;
  HTMLElement *c;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_> *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_51;
  string local_50 [39];
  byte local_29;
  size_t sStack_28;
  bool openTagIndented;
  size_t indent_local;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out_local;
  HTMLElement *this_local;
  PrintStatus status_local;
  
  sStack_28 = indent;
  indent_local = (size_t)out;
  out_local = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local._4_2_ = status;
  if ((((ushort)status & 1) == 0) && (((ushort)status & 0x100) == 0)) {
    if ((this->contentIsInline & 1U) == 0) {
      std::operator<<((ostream *)out,'\n');
    }
    this_local._4_2_ = (PrintStatus)CONCAT11(this_local._5_1_,true);
  }
  sVar2 = indent_local;
  sVar1 = sStack_28;
  local_e1 = 0;
  if (((ushort)this_local._4_2_ & 1) != 0) {
    local_e1 = this->contentIsInline ^ 0xff;
  }
  local_29 = local_e1 & 1;
  if (local_29 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,sVar1,' ',&local_51);
    std::operator<<((ostream *)sVar2,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  this_local._4_2_ = (PrintStatus)((ushort)this_local._4_2_ & 0xff00);
  poVar4 = std::operator<<((ostream *)indent_local,'<');
  std::operator<<(poVar4,(string *)this);
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->properties);
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->properties);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar3) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
    poVar4 = std::operator<<((ostream *)indent_local,' ');
    std::operator<<(poVar4,(string *)pbVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  std::operator<<((ostream *)indent_local,'>');
  this_local._4_2_ = (PrintStatus)((ushort)this_local._4_2_ & 0xff);
  __end3_1 = std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::begin
                       (&this->children);
  c = (HTMLElement *)
      std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::end
                (&this->children);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end3_1,
                       (__normal_iterator<const_choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
                        *)&c);
    if (!bVar3) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<const_choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
               ::operator*(&__end3_1);
    if ((local_a8->isContent & 1U) == 0) {
      local_ac = this_local._4_2_;
      local_aa = print<std::__cxx11::ostringstream>
                           (local_a8,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)indent_local,sStack_28 + 1,this_local._4_2_);
      this_local._4_2_ = local_aa;
    }
    else {
      std::operator<<((ostream *)indent_local,(string *)local_a8);
      this_local._4_2_ = (PrintStatus)CONCAT11(true,this_local._4_1_);
    }
    __gnu_cxx::
    __normal_iterator<const_choc::html::HTMLElement_*,_std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>_>
    ::operator++(&__end3_1);
  }
  if ((local_29 & 1) != 0) {
    bVar3 = std::vector<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>::empty
                      (&this->children);
    if ((!bVar3) && (((ushort)this_local._4_2_ & 0x100) == 0)) {
      poVar4 = std::operator<<((ostream *)indent_local,"\n");
      sVar1 = sStack_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d0,sVar1,' ',&local_d1);
      std::operator<<(poVar4,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
  }
  poVar4 = std::operator<<((ostream *)indent_local,"</");
  poVar4 = std::operator<<(poVar4,(string *)this);
  std::operator<<(poVar4,">");
  this_local._4_2_ = (PrintStatus)((ushort)this_local._4_2_ & 0xff);
  return this_local._4_2_;
}

Assistant:

PrintStatus print (Output& out, size_t indent, PrintStatus status) const
    {
        if (! (status.isAtStartOfLine || status.isFollowingContent))
        {
            if (! contentIsInline)
                out << '\n';

            status.isAtStartOfLine = true;
        }

        bool openTagIndented = status.isAtStartOfLine && ! contentIsInline;

        if (openTagIndented)
            out << std::string (indent, ' ');

        status.isAtStartOfLine = false;
        out << '<' << name;

        for (auto& p : properties)
            out << ' ' << p;

        out << '>';
        
        status.isFollowingContent = false;

        for (auto& c : children)
        {
            if (c.isContent)
            {
                out << c.name;
                status.isFollowingContent = true;
            }
            else
            {
                status = c.print (out, indent + 1, status);
            }
        }

        if (openTagIndented && ! (children.empty() || status.isFollowingContent))
            out << "\n" << std::string (indent, ' ');

        out << "</" << name << ">";

        status.isFollowingContent = false;
        return status;
    }